

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodeparser.cpp
# Opt level: O0

void __thiscall
NodeParser::parseCoords
          (NodeParser *this,Node *node,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  bool bVar1;
  size_type sVar2;
  InputError *pIVar3;
  string local_a8 [39];
  undefined1 local_81;
  string local_80 [32];
  reference local_60;
  string *tokens;
  allocator local_41;
  string local_40 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tokenList_local;
  Node *node_local;
  NodeParser *this_local;
  
  local_20 = tokenList;
  tokenList_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)node;
  node_local = (Node *)this;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(tokenList);
  if (sVar2 < 3) {
    tokens._3_1_ = 1;
    pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"",&local_41);
    InputError::InputError(pIVar3,2,(string *)local_40);
    tokens._3_1_ = 0;
    __cxa_throw(pIVar3,&InputError::typeinfo,InputError::~InputError);
  }
  local_60 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_20,0);
  bVar1 = Utilities::parseNumber<double>
                    (local_60 + 0x20,
                     (double *)
                     &tokenList_local[2].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  if (!bVar1) {
    local_81 = 1;
    pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string(local_80,(string *)(local_60 + 0x20));
    InputError::InputError(pIVar3,6,(string *)local_80);
    local_81 = 0;
    __cxa_throw(pIVar3,&InputError::typeinfo,InputError::~InputError);
  }
  bVar1 = Utilities::parseNumber<double>
                    (local_60 + 0x40,
                     (double *)
                     &tokenList_local[2].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (!bVar1) {
    pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string(local_a8,(string *)(local_60 + 0x40));
    InputError::InputError(pIVar3,6,(string *)local_a8);
    __cxa_throw(pIVar3,&InputError::typeinfo,InputError::~InputError);
  }
  return;
}

Assistant:

void NodeParser::parseCoords(Node* node, vector<string>& tokenList)
{
    // Contents of tokenList are:
    // 0 - node ID
    // 1 - x coordinate
    // 2 - y coordinate

    if ( tokenList.size() < 3 ) throw InputError(InputError::TOO_FEW_ITEMS, "");
    string* tokens = &tokenList[0];

    if ( !Utilities::parseNumber(tokens[1], node->xCoord) )
    {
        throw InputError(InputError::INVALID_NUMBER, tokens[1]);
    }
    if ( !Utilities::parseNumber(tokens[2], node->yCoord) )
    {
        throw InputError(InputError::INVALID_NUMBER, tokens[2]);
    }
}